

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map.h
# Opt level: O0

int * frozen::
      unordered_map<std::basic_string_view<char,std::char_traits<char>>,int,69ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
      ::
      at_impl<frozen::unordered_map<std::basic_string_view<char,std::char_traits<char>>,int,69ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>const&,std::__cxx11::string,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
                (unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_69UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 *self,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,
                elsa<std::basic_string_view<char,_std::char_traits<char>_>_> *hash,
                equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *equal)

{
  bool bVar1;
  value_type *pvVar2;
  out_of_range *this;
  value_type *kv;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_69UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *in_stack_ffffffffffffffa0;
  value_type *__y;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffb8;
  equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *in_stack_ffffffffffffffc0;
  
  pvVar2 = lookup<std::__cxx11::string,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>>
                     (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                      (elsa<std::basic_string_view<char,_std::char_traits<char>_>_> *)0x3882ec);
  __y = pvVar2;
  std::__cxx11::string::operator_cast_to_basic_string_view
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffffa0);
  bVar1 = CLI::std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                    (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,&__y->first);
  if (!bVar1) {
    this = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this,"unknown key");
    __cxa_throw(this,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  return &pvVar2->second;
}

Assistant:

static inline constexpr auto& at_impl(This&& self, KeyType const &key, Hasher const &hash, Equal const &equal) {
    auto& kv = self.lookup(key, hash);
    if (equal(kv.first, key))
      return kv.second;
    else
      FROZEN_THROW_OR_ABORT(std::out_of_range("unknown key"));
  }